

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O1

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  undefined8 *puVar2;
  spdlog_ex *this;
  int *piVar3;
  stat64 st;
  uint *local_f0;
  undefined8 local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  string local_d0;
  stat64 local_b0;
  
  if (f == (FILE *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Failed getting file size. fd is null","");
    *puVar2 = &PTR__spdlog_ex_001e7c68;
    puVar2[1] = puVar2 + 3;
    if (local_f0 == &local_e0) {
      *(uint *)(puVar2 + 3) = local_e0;
      *(undefined4 *)((long)puVar2 + 0x1c) = uStack_dc;
      *(undefined4 *)(puVar2 + 4) = uStack_d8;
      *(undefined4 *)((long)puVar2 + 0x24) = uStack_d4;
    }
    else {
      puVar2[1] = local_f0;
      puVar2[3] = CONCAT44(uStack_dc,local_e0);
    }
    puVar2[2] = local_e8;
    local_e8 = 0;
    local_e0 = local_e0 & 0xffffff00;
    local_f0 = &local_e0;
    __cxa_throw(puVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  iVar1 = fileno((FILE *)f);
  iVar1 = fstat64(iVar1,&local_b0);
  if (iVar1 == 0) {
    return local_b0.st_size;
  }
  this = (spdlog_ex *)__cxa_allocate_exception(0x28);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Failed getting file size from fd","");
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(this,&local_d0,*piVar3);
  __cxa_throw(this,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

inline size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        throw spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = _fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = _filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = _filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
    int fd = fileno(f);
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if !defined(__FreeBSD__) && !defined(__APPLE__) && (defined(__x86_64__) || defined(__ppc64__)) && !defined(__CYGWIN__)
    struct stat64 st;
    if (fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // unix 32 bits or cygwin
    struct stat st;

    if (fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    throw spdlog_ex("Failed getting file size from fd", errno);
}